

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_4ec2e9::BNTest_ASN1_Test::TestBody(BNTest_ASN1_Test *this)

{
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  internal iVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  ScopedTrace *this_00;
  char *pcVar9;
  _Head_base<0UL,_bignum_st_*,_false> in_R9;
  ScopedTrace gtest_trace_1423;
  CBS cbs_1;
  UniquePtr<BIGNUM> bn;
  CBS cbs;
  UniquePtr<BIGNUM> bn_1;
  ScopedCBB cbb;
  UniquePtr<uint8_t> delete_der;
  UniquePtr<BIGNUM> bn2;
  size_t der_len;
  uint8_t *der;
  ScopedTrace local_e1;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_b0 [8];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  Bytes local_a0;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_90;
  undefined1 local_88 [16];
  anon_union_32_2_4f6aaa2e_for_u local_78;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_58;
  _Head_base<0UL,_bignum_st_*,_false> local_50;
  long local_48;
  size_t local_40;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  
  lVar7 = 0x10;
  do {
    pcVar9 = *(char **)((long)&PTR_typeinfo_006d5940 + lVar7);
    local_48 = lVar7;
    testing::ScopedTrace::ScopedTrace
              (&local_e1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x58f,pcVar9);
    local_88._0_8_ = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    iVar6 = BN_asc2bn((BIGNUM **)local_88,pcVar9);
    local_90._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)local_88._0_8_;
    if (iVar6 == 0) {
      local_90._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    }
    iVar4 = (internal)
            ((tuple<bignum_st_*,_bssl::internal::Deleter>)
             local_90._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
            (_Head_base<0UL,_bignum_st_*,_false>)0x0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_e0[0] = iVar4;
    if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
        local_90._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
      testing::Message::Message((Message *)local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_e0,(AssertionResult *)0x53c60c,"false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x591,(char *)local_88._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_88._0_8_ != &local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78.base.buf + 1));
      }
      if (local_b0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b0 + 8))();
      }
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
LAB_002b2852:
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_90);
      this_00 = &local_e1;
      goto LAB_002b2861;
    }
    local_50._M_head_impl = (bignum_st *)BN_new();
    local_e0[0] = (internal)((BIGNUM *)local_50._M_head_impl != (BIGNUM *)0x0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIGNUM *)local_50._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_e0,(AssertionResult *)"bn2","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x595,(char *)local_88._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      _Var8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_88._0_8_ != &local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78.base.buf + 1));
        _Var8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
      }
LAB_002b2826:
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )_Var8._M_head_impl !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)_Var8._M_head_impl + 8))();
      }
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
      goto LAB_002b2852;
    }
    uVar1._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           *)&((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(&UNK_006d5948 + local_48))->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    _Var2.
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&(anonymous_namespace)::kASN1Tests + local_48))->
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ;
    local_b0 = (undefined1  [8])
               uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_a8._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )_Var2;
    iVar6 = BN_parse_asn1_unsigned((CBS *)local_b0,local_50._M_head_impl);
    local_e0[0] = (internal)(iVar6 != 0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_e0,
                 (AssertionResult *)"BN_parse_asn1_unsigned(&cbs, bn2.get())","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x598,(char *)local_88._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      _Var8._M_head_impl = local_c0._M_head_impl;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_88._0_8_ != &local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78.base.buf + 1));
        _Var8._M_head_impl = local_c0._M_head_impl;
      }
      goto LAB_002b2826;
    }
    local_c0._M_head_impl = local_c0._M_head_impl & 0xffffffff00000000;
    local_e0 = (undefined1  [8])
               local_a8._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_88,"0u","CBS_len(&cbs)",(uint *)&local_c0,(unsigned_long *)local_e0
              );
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_e0);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_88._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x599,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if (local_e0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_e0 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_88._8_8_);
    }
    in_R9._M_head_impl = local_50._M_head_impl;
    AssertBIGNUMSEqual((char *)local_88,"bn.get()","bn2.get()","decode ASN.1",
                       (BIGNUM *)
                       local_90._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,local_50._M_head_impl)
    ;
    if (local_88[0] == '\0') {
      testing::Message::Message((Message *)local_e0);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_88._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x59a,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if (local_e0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_e0 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_88 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_88._8_8_);
    }
    CBB_zero((CBB *)local_88);
    iVar6 = CBB_init((CBB *)local_88,0);
    local_c0._M_head_impl._0_1_ = iVar6 != 0;
    local_b8._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)&local_c0,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5a0,(char *)local_e0);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_a0);
LAB_002b22fc:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
      if (local_e0 != (undefined1  [8])&local_d0) {
        operator_delete((void *)local_e0,local_d0._M_allocated_capacity + 1);
      }
      if ((long *)local_a0.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_a0.span_.data_ + 8))();
      }
      if (local_b8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_b8._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
      }
      bVar5 = false;
    }
    else {
      iVar6 = BN_marshal_asn1((CBB *)local_88,
                              (BIGNUM *)
                              local_90._M_t.
                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
      local_c0._M_head_impl._0_1_ = iVar6 != 0;
      local_b8._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_e0,(internal *)&local_c0,
                   (AssertionResult *)"BN_marshal_asn1(cbb.get(), bn.get())","false","true",
                   (char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a1,(char *)local_e0);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_a0);
        goto LAB_002b22fc;
      }
      iVar6 = CBB_finish((CBB *)local_88,&local_38._M_head_impl,&local_40);
      local_c0._M_head_impl._0_1_ = iVar6 != 0;
      local_b8._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_e0,(internal *)&local_c0,
                   (AssertionResult *)"CBB_finish(cbb.get(), &der, &der_len)","false","true",
                   (char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a2,(char *)local_e0);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_a0);
        goto LAB_002b22fc;
      }
      local_58._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_38._M_head_impl;
      local_a0.span_.data_ = local_38._M_head_impl;
      local_a0.span_.size_ = local_40;
      local_c0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           uVar1._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_b8._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )_Var2;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_e0,"Bytes(test.der, test.der_len)","Bytes(der, der_len)",
                 (Bytes *)&local_c0,&local_a0);
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c0);
        pcVar9 = "";
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = (local_d8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a4,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if ((BIGNUM *)local_c0._M_head_impl != (BIGNUM *)0x0) {
          (**(code **)(*(long *)local_c0._M_head_impl + 8))();
        }
      }
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_58);
      bVar5 = true;
    }
    CBB_cleanup((CBB *)local_88);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_90);
    testing::ScopedTrace::~ScopedTrace(&local_e1);
    if (!bVar5) {
      return;
    }
    lVar7 = local_48 + 0x18;
  } while (lVar7 != 0xb8);
  lVar7 = 8;
  while( true ) {
    uVar1._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           *)&((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(&UNK_006d59f8 + lVar7))->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((long)&(anonymous_namespace)::kASN1InvalidTests + lVar7);
    local_88._0_8_ =
         uVar1._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    local_88._8_8_ = pbVar3;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x5a8,(Bytes *)local_88);
    local_c0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)BN_new();
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIGNUM *)local_c0._M_head_impl == (BIGNUM *)0x0) break;
    local_e0 = (undefined1  [8])
               uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_d8 = pbVar3;
    iVar6 = BN_parse_asn1_unsigned((CBS *)local_e0,(BIGNUM *)local_c0._M_head_impl);
    local_b0[0] = iVar6 == 0;
    local_a8._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (iVar6 != 0) {
      testing::Message::Message((Message *)&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_a0.span_.data_ + 0x10),"Parsed invalid input.",0x15);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)local_b0,
                 (AssertionResult *)"BN_parse_asn1_unsigned(&cbs, bn.get())","true","false",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5ad,(char *)local_88._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_88._0_8_ != &local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78.base.buf + 1));
      }
      if ((long *)local_a0.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_a0.span_.data_ + 8))();
      }
      if (local_a8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a8._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
      }
    }
    ERR_clear_error();
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_c0);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_50);
    lVar7 = lVar7 + 0x10;
    if (lVar7 == 0x58) {
      local_88._0_8_ = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
      iVar6 = BN_asc2bn((BIGNUM **)local_88,"-1");
      local_c0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (anon_union_32_2_4f6aaa2e_for_u *)0x0;
      if (iVar6 != 0) {
        local_c0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_88._0_8_;
      }
      local_e0[0] = (internal)
                    ((anon_union_32_2_4f6aaa2e_for_u *)local_c0._M_head_impl !=
                    (anon_union_32_2_4f6aaa2e_for_u *)0x0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_c0._M_head_impl ==
          (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
        testing::Message::Message((Message *)local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_88,(internal *)local_e0,(AssertionResult *)0x53c60c,"false",
                   "true",(char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5b4,(char *)local_88._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if ((anon_union_32_2_4f6aaa2e_for_u *)local_88._0_8_ != &local_78) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_78.base.buf + 1));
        }
        if (local_b0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b0 + 8))();
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
      }
      else {
        CBB_zero((CBB *)local_88);
        iVar6 = CBB_init((CBB *)local_88,0);
        local_b0[0] = iVar6 != 0;
        local_a8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (iVar6 == 0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_e0,(internal *)local_b0,
                     (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_90,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x5b6,(char *)local_e0);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_a0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
          if (local_e0 != (undefined1  [8])&local_d0) {
            operator_delete((void *)local_e0,local_d0._M_allocated_capacity + 1);
          }
          if ((long *)local_a0.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_a0.span_.data_ + 8))();
          }
          if (local_a8._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
          }
        }
        else {
          iVar6 = BN_marshal_asn1((CBB *)local_88,(BIGNUM *)local_c0._M_head_impl);
          local_b0[0] = iVar6 == 0;
          local_a8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (iVar6 != 0) {
            testing::Message::Message((Message *)&local_a0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)((long)local_a0.span_.data_ + 0x10),"Serialized negative number.",
                       0x1b);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_e0,(internal *)local_b0,
                       (AssertionResult *)"BN_marshal_asn1(cbb.get(), bn.get())","true","false",
                       (char *)in_R9._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_90,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x5b7,(char *)local_e0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_90,(Message *)&local_a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
            if (local_e0 != (undefined1  [8])&local_d0) {
              operator_delete((void *)local_e0,local_d0._M_allocated_capacity + 1);
            }
            if ((long *)local_a0.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_a0.span_.data_ + 8))();
            }
            if (local_a8._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
                (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
            }
          }
          ERR_clear_error();
        }
        CBB_cleanup((CBB *)local_88);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_c0);
      return;
    }
  }
  local_e0[0] = (internal)((BIGNUM *)local_c0._M_head_impl != (BIGNUM *)0x0);
  testing::Message::Message((Message *)local_b0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_88,(internal *)local_e0,(AssertionResult *)0x53c60c,"false","true",
             (char *)in_R9._M_head_impl);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
             ,0x5aa,(char *)local_88._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_b0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
  if ((anon_union_32_2_4f6aaa2e_for_u *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78.base.buf + 1));
  }
  if (local_b0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_b0 + 8))();
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_c0);
  this_00 = (ScopedTrace *)&local_50;
LAB_002b2861:
  testing::ScopedTrace::~ScopedTrace(this_00);
  return;
}

Assistant:

TEST_F(BNTest, ASN1) {
  for (const ASN1Test &test : kASN1Tests) {
    SCOPED_TRACE(test.value_ascii);
    bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM(test.value_ascii);
    ASSERT_TRUE(bn);

    // Test that the input is correctly parsed.
    bssl::UniquePtr<BIGNUM> bn2(BN_new());
    ASSERT_TRUE(bn2);
    CBS cbs;
    CBS_init(&cbs, reinterpret_cast<const uint8_t *>(test.der), test.der_len);
    ASSERT_TRUE(BN_parse_asn1_unsigned(&cbs, bn2.get()));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_BIGNUMS_EQUAL("decode ASN.1", bn.get(), bn2.get());

    // Test the value serializes correctly.
    bssl::ScopedCBB cbb;
    uint8_t *der;
    size_t der_len;
    ASSERT_TRUE(CBB_init(cbb.get(), 0));
    ASSERT_TRUE(BN_marshal_asn1(cbb.get(), bn.get()));
    ASSERT_TRUE(CBB_finish(cbb.get(), &der, &der_len));
    bssl::UniquePtr<uint8_t> delete_der(der);
    EXPECT_EQ(Bytes(test.der, test.der_len), Bytes(der, der_len));
  }

  for (const ASN1InvalidTest &test : kASN1InvalidTests) {
    SCOPED_TRACE(Bytes(test.der, test.der_len));
    bssl::UniquePtr<BIGNUM> bn(BN_new());
    ASSERT_TRUE(bn);
    CBS cbs;
    CBS_init(&cbs, reinterpret_cast<const uint8_t *>(test.der), test.der_len);
    EXPECT_FALSE(BN_parse_asn1_unsigned(&cbs, bn.get()))
        << "Parsed invalid input.";
    ERR_clear_error();
  }

  // Serializing negative numbers is not supported.
  bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM("-1");
  ASSERT_TRUE(bn);
  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  EXPECT_FALSE(BN_marshal_asn1(cbb.get(), bn.get()))
      << "Serialized negative number.";
  ERR_clear_error();
}